

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void rchold(double *A,int N,int stride,double *U22)

{
  double alpha;
  int iVar1;
  double d1;
  int w;
  int u;
  int i;
  int j;
  double *U22_local;
  int stride_local;
  int N_local;
  double *A_local;
  
  if (N != 1) {
    alpha = *A;
    for (u = 1; u < N; u = u + 1) {
      A[u] = A[u] / alpha;
    }
    mmult(A + 1,A + 1,U22,N + -1,1,N + -1);
    scale(U22,N + -1,N + -1,alpha);
    for (w = 0; w < N + -1; w = w + 1) {
      for (u = w; u < N + -1; u = u + 1) {
        iVar1 = u + stride + 1 + w * stride;
        A[iVar1] = A[iVar1] - U22[u + w * (N + -1)];
      }
    }
    rchold(A + (long)stride + 1,N + -1,stride,U22);
  }
  return;
}

Assistant:

static void rchold(double *A,int N, int stride, double *U22) {
	int j,i,u,w;
	double d1;
	
	if (N == 1) {
		return;
	} else {
		d1 = A[0];
		for (j = 1; j < N;++j) {
			A[j] /= d1;
		}
		mmult(A+1,A+1,U22,N-1,1,N-1);
		scale(U22,N-1,N-1,d1);
		for (i = 0; i < N-1; ++i) {
			u = stride + 1+ i * stride;
			w = i * (N-1);
			for(j = i; j < N-1;j++) {
				A[j + u] -= U22[j + w];
			}
		}
		
		rchold(A+stride+1,N-1,stride,U22);
	
	}
		
}